

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ServiceDescriptorTest_FindMethodByName_Test::TestBody
          (ServiceDescriptorTest_FindMethodByName_Test *this)

{
  ServiceDescriptor *pSVar1;
  bool bVar2;
  char *pcVar3;
  MethodDescriptor *pMVar4;
  char *in_R9;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  string_view local_1d8;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_190;
  Message local_188;
  string_view local_180;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_138;
  Message local_130;
  string_view local_128;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  Message local_f8;
  string_view local_f0;
  MethodDescriptor *local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  string_view local_b8;
  MethodDescriptor *local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  string_view local_80;
  MethodDescriptor *local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  string_view local_38;
  MethodDescriptor *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ServiceDescriptorTest_FindMethodByName_Test *this_local;
  
  pSVar1 = (this->super_ServiceDescriptorTest).service_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"Foo");
  local_28 = ServiceDescriptor::FindMethodByName(pSVar1,local_38);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::MethodDescriptor_*,_const_google::protobuf::MethodDescriptor_*,_nullptr>
            ((EqHelper *)local_20,"foo_","service_->FindMethodByName(\"Foo\")",
             &(this->super_ServiceDescriptorTest).foo_,&local_28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pSVar1 = (this->super_ServiceDescriptorTest).service_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"Bar");
  local_70 = ServiceDescriptor::FindMethodByName(pSVar1,local_80);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::MethodDescriptor_*,_const_google::protobuf::MethodDescriptor_*,_nullptr>
            ((EqHelper *)local_68,"bar_","service_->FindMethodByName(\"Bar\")",
             &(this->super_ServiceDescriptorTest).bar_,&local_70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7ac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  pSVar1 = (this->super_ServiceDescriptorTest).service2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"Foo");
  local_a8 = ServiceDescriptor::FindMethodByName(pSVar1,local_b8);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::MethodDescriptor_*,_const_google::protobuf::MethodDescriptor_*,_nullptr>
            ((EqHelper *)local_a0,"foo2_","service2_->FindMethodByName(\"Foo\")",
             &(this->super_ServiceDescriptorTest).foo2_,&local_a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  pSVar1 = (this->super_ServiceDescriptorTest).service2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"Baz");
  local_e0 = ServiceDescriptor::FindMethodByName(pSVar1,local_f0);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::MethodDescriptor_*,_const_google::protobuf::MethodDescriptor_*,_nullptr>
            ((EqHelper *)local_d8,"baz2_","service2_->FindMethodByName(\"Baz\")",
             &(this->super_ServiceDescriptorTest).baz2_,&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pSVar1 = (this->super_ServiceDescriptorTest).service_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,"NoSuchMethod");
  pMVar4 = ServiceDescriptor::FindMethodByName(pSVar1,local_128);
  local_111 = pMVar4 == (MethodDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_110,
               (AssertionResult *)"service_->FindMethodByName(\"NoSuchMethod\") == nullptr","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7b0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  pSVar1 = (this->super_ServiceDescriptorTest).service_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"Baz");
  pMVar4 = ServiceDescriptor::FindMethodByName(pSVar1,local_180);
  local_169 = pMVar4 == (MethodDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_168,
               (AssertionResult *)"service_->FindMethodByName(\"Baz\") == nullptr","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7b1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pSVar1 = (this->super_ServiceDescriptorTest).service2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"Bar");
  pMVar4 = ServiceDescriptor::FindMethodByName(pSVar1,local_1d8);
  local_1c1 = pMVar4 == (MethodDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)local_1c0,
               (AssertionResult *)"service2_->FindMethodByName(\"Bar\") == nullptr","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x7b2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  return;
}

Assistant:

TEST_F(ServiceDescriptorTest, FindMethodByName) {
  EXPECT_EQ(foo_, service_->FindMethodByName("Foo"));
  EXPECT_EQ(bar_, service_->FindMethodByName("Bar"));
  EXPECT_EQ(foo2_, service2_->FindMethodByName("Foo"));
  EXPECT_EQ(baz2_, service2_->FindMethodByName("Baz"));

  EXPECT_TRUE(service_->FindMethodByName("NoSuchMethod") == nullptr);
  EXPECT_TRUE(service_->FindMethodByName("Baz") == nullptr);
  EXPECT_TRUE(service2_->FindMethodByName("Bar") == nullptr);
}